

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O3

UINT8 __thiscall DROPlayer::Seek(DROPlayer *this,UINT8 unit,UINT32 pos)

{
  int iVar1;
  undefined7 in_register_00000031;
  
  iVar1 = (int)CONCAT71(in_register_00000031,unit);
  if (iVar1 == 2) {
    pos = (*(this->super_PlayerBase)._vptr_PlayerBase[0x16])(this,(ulong)pos);
  }
  else if (iVar1 != 1) {
    if (iVar1 == 0) {
      this->_playState = this->_playState | 8;
      if (pos < this->_filePos) {
        (*(this->super_PlayerBase)._vptr_PlayerBase[0x21])(this);
      }
      SeekToFilePos(this,pos);
      return '\0';
    }
    return 0xff;
  }
  this->_playState = this->_playState | 8;
  if (pos < this->_playTick) {
    (*(this->super_PlayerBase)._vptr_PlayerBase[0x21])(this);
  }
  SeekToTick(this,pos);
  return '\0';
}

Assistant:

UINT8 DROPlayer::Seek(UINT8 unit, UINT32 pos)
{
	switch(unit)
	{
	case PLAYPOS_FILEOFS:
		_playState |= PLAYSTATE_SEEK;
		if (pos < _filePos)
			Reset();
		return SeekToFilePos(pos);
	case PLAYPOS_SAMPLE:
		pos = Sample2Tick(pos);
		// fall through
	case PLAYPOS_TICK:
		_playState |= PLAYSTATE_SEEK;
		if (pos < _playTick)
			Reset();
		return SeekToTick(pos);
	case PLAYPOS_COMMAND:
	default:
		return 0xFF;
	}
}